

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_server_ping(pcp_server_t *s)

{
  pcp_flow_state_e pVar1;
  pcp_flow_t *f;
  pcp_flow_t *msg;
  pcp_server_t *s_local;
  
  s->ping_count = 0;
  do {
    f = get_ping_msg(s);
    if (f == (pcp_flow_t *)0x0) {
      (s->next_timeout).tv_sec = 0;
      (s->next_timeout).tv_usec = 0;
      return pss_ping;
    }
    f->retry_count = 0;
    pcp_logger(PCP_LOGLVL_INFO,"Pinging PCP server at address %s",s->pcp_server_paddr);
    pVar1 = handle_flow_event(f,fev_send,(pcp_recv_msg_t *)0x0);
  } while (pVar1 == pfs_failed);
  (s->next_timeout).tv_sec = (f->timeout).tv_sec;
  (s->next_timeout).tv_usec = (f->timeout).tv_usec;
  return pss_wait_ping_resp;
}

Assistant:

static pcp_server_state_e handle_server_ping(pcp_server_t *s) {
    pcp_flow_t *msg = NULL;
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    s->ping_count = 0;

    while ((msg = get_ping_msg(s)) != NULL) {
        msg->retry_count = 0;

        PCP_LOG(PCP_LOGLVL_INFO, "Pinging PCP server at address %s",
                s->pcp_server_paddr);

        if (handle_flow_event(msg, fev_send, NULL) != pfs_failed) {
            s->next_timeout = msg->timeout;

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return pss_wait_ping_resp;
        }
    }
    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;
    return pss_ping;
}